

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ParseTorReplyMapping
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,string *s)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pcVar3;
  mapped_type *this;
  byte __c;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  string escaped_value;
  string value;
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar6 = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar9 = s->_M_string_length;
    if (uVar9 <= uVar6) {
LAB_008903c4:
      std::_Rb_tree_header::_Rb_tree_header
                (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,
                 &mapping._M_t._M_impl.super__Rb_tree_header);
LAB_008903da:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&mapping._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    for (; ((uVar6 < uVar9 && (cVar4 = (s->_M_dataplus)._M_p[uVar6], cVar4 != ' ')) &&
           (cVar4 != '=')); uVar6 = uVar6 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&key,cVar4);
      uVar9 = s->_M_string_length;
    }
    if (uVar6 == uVar9) {
LAB_00890379:
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      goto LAB_008903da;
    }
    pcVar3 = (s->_M_dataplus)._M_p;
    if (pcVar3[uVar6] == ' ') {
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      goto LAB_008903c4;
    }
    uVar10 = uVar6 + 1;
    if ((uVar10 < uVar9) && (pcVar3[uVar6 + 1] == '\"')) {
      bVar7 = false;
      for (uVar6 = uVar6 + 2;
          (uVar6 < uVar9 && (cVar4 = (s->_M_dataplus)._M_p[uVar6], cVar4 != '\"' || bVar7));
          uVar6 = uVar6 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&value,cVar4);
        bVar7 = (bool)((bVar7 ^ 1U) & cVar4 == '\\');
        uVar9 = s->_M_string_length;
      }
      if (uVar6 == uVar9) goto LAB_00890379;
      escaped_value._M_dataplus._M_p = (pointer)&escaped_value.field_2;
      escaped_value._M_string_length = 0;
      uVar6 = uVar6 + 1;
      escaped_value.field_2._M_local_buf[0] = '\0';
      for (uVar9 = 0; uVar9 < value._M_string_length; uVar9 = uVar9 + 1) {
        if (value._M_dataplus._M_p[uVar9] == '\\') {
          uVar10 = uVar9 + 1;
          __c = value._M_dataplus._M_p[uVar9 + 1];
          if (__c == 0x74) {
            __c = 9;
          }
          else if (__c == 0x72) {
            __c = 0xd;
          }
          else if (__c == 0x6e) {
            __c = 10;
          }
          else if ((__c & 0xf8) == 0x30) {
            uVar9 = uVar9 + 2;
            for (lVar8 = -1; lVar8 != -3; lVar8 = lVar8 + -1) {
              if ((value._M_string_length <= uVar9) ||
                 ((value._M_dataplus._M_p[uVar9] & 0xf8U) != 0x30)) {
                uVar9 = -lVar8;
                goto LAB_008902dd;
              }
              uVar9 = uVar9 + 1;
            }
            uVar9 = (ulong)('3' < (char)__c) ^ 3;
LAB_008902dd:
            uVar9 = uVar9 + uVar10;
            cVar4 = '\0';
            for (uVar5 = uVar10; uVar5 < uVar9; uVar5 = uVar5 + 1) {
              cVar4 = cVar4 * '\b' + value._M_dataplus._M_p[uVar5] + -0x30;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&escaped_value,cVar4);
            if (uVar10 < uVar9) {
              uVar10 = uVar9;
            }
            uVar9 = uVar10 - 1;
            goto LAB_008902c0;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&escaped_value,__c);
          uVar9 = uVar10;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&escaped_value,value._M_dataplus._M_p[uVar9]);
        }
LAB_008902c0:
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&value,&escaped_value);
      std::__cxx11::string::~string((string *)&escaped_value);
      uVar9 = s->_M_string_length;
    }
    else {
      while ((uVar6 = uVar10, uVar6 < uVar9 && (cVar4 = (s->_M_dataplus)._M_p[uVar6], cVar4 != ' '))
            ) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&value,cVar4);
        uVar9 = s->_M_string_length;
        uVar10 = uVar6 + 1;
      }
    }
    if (uVar6 < uVar9) {
      uVar6 = ((s->_M_dataplus)._M_p[uVar6] == ' ') + uVar6;
    }
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&mapping,&key);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this,&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  } while( true );
}

Assistant:

std::map<std::string,std::string> ParseTorReplyMapping(const std::string &s)
{
    std::map<std::string,std::string> mapping;
    size_t ptr=0;
    while (ptr < s.size()) {
        std::string key, value;
        while (ptr < s.size() && s[ptr] != '=' && s[ptr] != ' ') {
            key.push_back(s[ptr]);
            ++ptr;
        }
        if (ptr == s.size()) // unexpected end of line
            return std::map<std::string,std::string>();
        if (s[ptr] == ' ') // The remaining string is an OptArguments
            break;
        ++ptr; // skip '='
        if (ptr < s.size() && s[ptr] == '"') { // Quoted string
            ++ptr; // skip opening '"'
            bool escape_next = false;
            while (ptr < s.size() && (escape_next || s[ptr] != '"')) {
                // Repeated backslashes must be interpreted as pairs
                escape_next = (s[ptr] == '\\' && !escape_next);
                value.push_back(s[ptr]);
                ++ptr;
            }
            if (ptr == s.size()) // unexpected end of line
                return std::map<std::string,std::string>();
            ++ptr; // skip closing '"'
            /**
             * Unescape value. Per https://spec.torproject.org/control-spec section 2.1.1:
             *
             *   For future-proofing, controller implementers MAY use the following
             *   rules to be compatible with buggy Tor implementations and with
             *   future ones that implement the spec as intended:
             *
             *     Read \n \t \r and \0 ... \377 as C escapes.
             *     Treat a backslash followed by any other character as that character.
             */
            std::string escaped_value;
            for (size_t i = 0; i < value.size(); ++i) {
                if (value[i] == '\\') {
                    // This will always be valid, because if the QuotedString
                    // ended in an odd number of backslashes, then the parser
                    // would already have returned above, due to a missing
                    // terminating double-quote.
                    ++i;
                    if (value[i] == 'n') {
                        escaped_value.push_back('\n');
                    } else if (value[i] == 't') {
                        escaped_value.push_back('\t');
                    } else if (value[i] == 'r') {
                        escaped_value.push_back('\r');
                    } else if ('0' <= value[i] && value[i] <= '7') {
                        size_t j;
                        // Octal escape sequences have a limit of three octal digits,
                        // but terminate at the first character that is not a valid
                        // octal digit if encountered sooner.
                        for (j = 1; j < 3 && (i+j) < value.size() && '0' <= value[i+j] && value[i+j] <= '7'; ++j) {}
                        // Tor restricts first digit to 0-3 for three-digit octals.
                        // A leading digit of 4-7 would therefore be interpreted as
                        // a two-digit octal.
                        if (j == 3 && value[i] > '3') {
                            j--;
                        }
                        const auto end{i + j};
                        uint8_t val{0};
                        while (i < end) {
                            val *= 8;
                            val += value[i++] - '0';
                        }
                        escaped_value.push_back(char(val));
                        // Account for automatic incrementing at loop end
                        --i;
                    } else {
                        escaped_value.push_back(value[i]);
                    }
                } else {
                    escaped_value.push_back(value[i]);
                }
            }
            value = escaped_value;
        } else { // Unquoted value. Note that values can contain '=' at will, just no spaces
            while (ptr < s.size() && s[ptr] != ' ') {
                value.push_back(s[ptr]);
                ++ptr;
            }
        }
        if (ptr < s.size() && s[ptr] == ' ')
            ++ptr; // skip ' ' after key=value
        mapping[key] = value;
    }
    return mapping;
}